

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name,int fixed)

{
  char cVar1;
  StkId pSVar2;
  lu_byte lVar3;
  byte bVar4;
  Table *x__1;
  LClosure *o;
  Proto *f;
  char *pcVar5;
  LClosure *x_;
  int i;
  int local_58;
  undefined4 uStack_54;
  LoadState local_50;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_50.fixed = (lu_byte)fixed;
  local_50.offset = 1;
  local_50.L = L;
  local_50.Z = Z;
  local_50.name = name;
  checkliteral(&local_50,"Lua","not a binary chunk");
  lVar3 = loadByte(&local_50);
  if (lVar3 == 'U') {
    lVar3 = loadByte(&local_50);
    if (lVar3 == '\0') {
      checkliteral(&local_50,anon_var_dwarf_eb9b,"corrupted chunk");
      checknumsize(&local_50,4,"int");
      loadBlock(&local_50,&local_58,4);
      if (local_58 == -0x5678) {
        checknumsize(&local_50,4,"instruction");
        loadBlock(&local_50,&local_58,4);
        if (local_58 == 0x12345678) {
          checknumsize(&local_50,8,"Lua integer");
          loadBlock(&local_50,&local_58,8);
          if (CONCAT44(uStack_54,local_58) == -0x5678) {
            checknumsize(&local_50,8,"Lua number");
            loadBlock(&local_50,&local_58,8);
            if (((double)CONCAT44(uStack_54,local_58) == -370.5) &&
               (!NAN((double)CONCAT44(uStack_54,local_58)))) {
              bVar4 = loadByte(&local_50);
              o = luaF_newLclosure(L,(uint)bVar4);
              pSVar2 = (L->top).p;
              *(LClosure **)pSVar2 = o;
              (pSVar2->val).tt_ = 'F';
              luaD_inctop(L);
              local_50.h = luaH_new(L);
              local_50.nstr = 0;
              pSVar2 = (L->top).p;
              (pSVar2->val).value_.gc = (GCObject *)local_50.h;
              (pSVar2->val).tt_ = 'E';
              luaD_inctop(L);
              f = luaF_newproto(L);
              o->p = f;
              if (((o->marked & 0x20) != 0) && ((f->marked & 0x18) != 0)) {
                luaC_barrier_(L,(GCObject *)o,(GCObject *)f);
                f = o->p;
              }
              loadFunction(&local_50,f);
              if (o->p->sizeupvalues == (uint)o->nupvalues) {
                (L->top).p = (StkId)((L->top).offset + -0x10);
                return o;
              }
              pcVar5 = "corrupted chunk";
              goto LAB_0011eb56;
            }
            pcVar5 = "Lua number";
          }
          else {
            pcVar5 = "Lua integer";
          }
        }
        else {
          pcVar5 = "instruction";
        }
      }
      else {
        pcVar5 = "int";
      }
      numerror(&local_50,"format",pcVar5);
    }
    pcVar5 = "format mismatch";
  }
  else {
    pcVar5 = "version mismatch";
  }
LAB_0011eb56:
  error(&local_50,pcVar5);
}

Assistant:

LClosure *luaU_undump (lua_State *L, ZIO *Z, const char *name, int fixed) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  S.fixed = cast_byte(fixed);
  S.offset = 1;  /* fist byte was already read */
  checkHeader(&S);
  cl = luaF_newLclosure(L, loadByte(&S));
  setclLvalue2s(L, L->top.p, cl);
  luaD_inctop(L);
  S.h = luaH_new(L);  /* create list of saved strings */
  S.nstr = 0;
  sethvalue2s(L, L->top.p, S.h);  /* anchor it */
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  loadFunction(&S, cl->p);
  if (cl->nupvalues != cl->p->sizeupvalues)
    error(&S, "corrupted chunk");
  luai_verifycode(L, cl->p);
  L->top.p--;  /* pop table */
  return cl;
}